

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_cmp_mpi(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  size_t j;
  size_t i;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  int local_4;
  
  for (i = (size_t)X->n; (i != 0 && (X->p[i - 1] == 0)); i = i - 1) {
  }
  for (j = (size_t)Y->n; (j != 0 && (Y->p[j - 1] == 0)); j = j - 1) {
  }
  if ((i == 0) && (j == 0)) {
    local_4 = 0;
  }
  else if (j < i) {
    local_4 = (int)X->s;
  }
  else if (i < j) {
    local_4 = -(int)Y->s;
  }
  else if ((X->s < 1) || (-1 < Y->s)) {
    if ((Y->s < 1) || (-1 < X->s)) {
      for (; i != 0; i = i - 1) {
        if (Y->p[i - 1] < X->p[i - 1]) {
          return (int)X->s;
        }
        if (X->p[i - 1] < Y->p[i - 1]) {
          return -(int)X->s;
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int mbedtls_mpi_cmp_mpi(const mbedtls_mpi *X, const mbedtls_mpi *Y)
{
    size_t i, j;

    for (i = X->n; i > 0; i--) {
        if (X->p[i - 1] != 0) {
            break;
        }
    }

    for (j = Y->n; j > 0; j--) {
        if (Y->p[j - 1] != 0) {
            break;
        }
    }

    if (i == 0 && j == 0) {
        return 0;
    }

    if (i > j) {
        return X->s;
    }
    if (j > i) {
        return -Y->s;
    }

    if (X->s > 0 && Y->s < 0) {
        return 1;
    }
    if (Y->s > 0 && X->s < 0) {
        return -1;
    }

    for (; i > 0; i--) {
        if (X->p[i - 1] > Y->p[i - 1]) {
            return X->s;
        }
        if (X->p[i - 1] < Y->p[i - 1]) {
            return -X->s;
        }
    }

    return 0;
}